

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

CFeeRate wallet::GetDiscardRate(CWallet *wallet)

{
  long lVar1;
  Chain *pCVar2;
  long lVar3;
  undefined4 uVar4;
  long lVar5;
  CFeeRate CVar6;
  long lVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (wallet->m_chain != (Chain *)0x0) {
    uVar4 = (**(code **)(*(long *)wallet->m_chain + 0xe0))();
    pCVar2 = wallet->m_chain;
    if (pCVar2 != (Chain *)0x0) {
      lVar5 = (**(code **)(*(long *)pCVar2 + 0xd8))(pCVar2,uVar4,0,0);
      if (wallet->m_chain != (Chain *)0x0) {
        lVar3 = (wallet->m_discard_rate).nSatoshisPerK;
        lVar7 = lVar5;
        if (lVar3 < lVar5) {
          lVar7 = lVar3;
        }
        if (lVar5 == 0) {
          lVar7 = lVar3;
        }
        CVar6.nSatoshisPerK = (**(code **)(*(long *)wallet->m_chain + 0x100))();
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          if (CVar6.nSatoshisPerK < lVar7) {
            CVar6.nSatoshisPerK = lVar7;
          }
          return (CFeeRate)CVar6.nSatoshisPerK;
        }
        __stack_chk_fail();
      }
    }
  }
  __assert_fail("m_chain",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
}

Assistant:

CFeeRate GetDiscardRate(const CWallet& wallet)
{
    unsigned int highest_target = wallet.chain().estimateMaxBlocks();
    CFeeRate discard_rate = wallet.chain().estimateSmartFee(highest_target, /*conservative=*/false);
    // Don't let discard_rate be greater than longest possible fee estimate if we get a valid fee estimate
    discard_rate = (discard_rate == CFeeRate(0)) ? wallet.m_discard_rate : std::min(discard_rate, wallet.m_discard_rate);
    // Discard rate must be at least dust relay feerate
    discard_rate = std::max(discard_rate, wallet.chain().relayDustFee());
    return discard_rate;
}